

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

bool operator<(BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               *l,BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                  *r)

{
  bool bVar1;
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  *r_local;
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  *l_local;
  
  bVar1 = std::operator<(&l->Value,&r->Value);
  return bVar1;
}

Assistant:

bool operator<(BT<T> const& l, BT<T> const& r)
  {
    return l.Value < r.Value;
  }